

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<State,_std::allocator<State>_> *
ParseLine(vector<State,_std::allocator<State>_> *__return_storage_ptr__,string *rowString)

{
  bool bVar1;
  istream *piVar2;
  value_type local_1bc [6];
  undefined1 local_1a1;
  int local_1a0;
  char local_199;
  int n;
  char c;
  istringstream my_stream;
  string *rowString_local;
  vector<State,_std::allocator<State>_> *rowVector;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&n,rowString,8);
  local_1a1 = 0;
  std::vector<State,_std::allocator<State>_>::vector(__return_storage_ptr__);
  while( true ) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&n,&local_1a0);
    piVar2 = std::operator>>(piVar2,&local_199);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1 || local_199 != ',') break;
    if (local_1a0 == 0) {
      local_1bc[1] = 0;
      std::vector<State,_std::allocator<State>_>::push_back(__return_storage_ptr__,local_1bc + 1);
    }
    else {
      local_1bc[0] = kObstacle;
      std::vector<State,_std::allocator<State>_>::push_back(__return_storage_ptr__,local_1bc);
    }
  }
  local_1a1 = 1;
  std::__cxx11::istringstream::~istringstream((istringstream *)&n);
  return __return_storage_ptr__;
}

Assistant:

vector<State> ParseLine( string rowString )
{
// parseLine function accepts a string as it's parameter and parses the line read from the file to
// extract the data from the file, store them into variable, converts them to the enumerated datatype
// and stores the enumerated data type to vector and returns it.

    istringstream my_stream(rowString);
    // Creates an object of istringstream class which is used to process the string.

    char c;
    int n;
    vector<State> rowVector;
    // Initialise the variables to be used to fetch the value from the string.

    while(my_stream >> n >> c && c ==',')
    {
        // Streams string till the string is non empty and is a combination of integer and a character,
        // further checks if the string ends with comma(,)
        if(n == 0)
        {
            // If element is zero, we mark it as empty element.
            rowVector.push_back(State::kEmpty);
        }
        else
        {
            // If element is non-zero we mark it as an obstacle.
            rowVector.push_back(State::kObstacle);
        }
    }

    return rowVector;
    // Returns a row in the form of vector after processing the input string.
}